

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateAttachmentStates
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 SubpassIndex)

{
  Uint32 *Args_2;
  RENDER_DEVICE_TYPE RVar1;
  RenderPassVkImpl *Args_1;
  ITextureView *pIVar2;
  int iVar3;
  RESOURCE_STATE RVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureVkImpl *pTVar5;
  FramebufferVkImpl *pFVar6;
  Uint32 i;
  ulong uVar7;
  long lVar8;
  undefined4 in_stack_ffffffffffffff98;
  string msg;
  
  if (this->m_RenderPassAttachmentsTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
    if ((this->m_pActiveRenderPass).m_pObject == (RenderPassVkImpl *)0x0) {
      FormatString<char[31]>(&msg,(char (*) [31])"There is no active render pass");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5ff);
      std::__cxx11::string::~string((string *)&msg);
    }
    pFVar6 = (this->m_pBoundFramebuffer).m_pObject;
    if (pFVar6 == (FramebufferVkImpl *)0x0) {
      FormatString<char[31]>(&msg,(char (*) [31])"There is no active framebuffer");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x600);
      std::__cxx11::string::~string((string *)&msg);
      pFVar6 = (this->m_pBoundFramebuffer).m_pObject;
    }
    Args_1 = (this->m_pActiveRenderPass).m_pObject;
    Args_2 = &(Args_1->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.AttachmentCount;
    if ((pFVar6->super_FramebufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
        .m_Desc.AttachmentCount !=
        (Args_1->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount) {
      FormatString<char[31],unsigned_int,char[60],unsigned_int,char[2]>
                (&msg,(Diligent *)"Framebuffer attachment count (",
                 (char (*) [31])
                 &(pFVar6->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                  .m_Desc.AttachmentCount,
                 (uint *)") is not consistent with the render pass attachment count (",
                 (char (*) [60])Args_2,(uint *)0x647201,
                 (char (*) [2])CONCAT44(SubpassIndex,in_stack_ffffffffffffff98));
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x605);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((Args_1->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.SubpassCount < SubpassIndex) {
      FormatString<char[26],char[36]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SubpassIndex <= RPDesc.SubpassCount",(char (*) [36])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x606);
      std::__cxx11::string::~string((string *)&msg);
    }
    RVar1 = (((this->m_pDevice).m_pObject)->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Type;
    lVar8 = 0xc;
    for (uVar7 = 0; uVar7 < *Args_2; uVar7 = uVar7 + 1) {
      pIVar2 = (pFVar6->super_FramebufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
               .m_Desc.ppAttachments[uVar7];
      if (pIVar2 != (ITextureView *)0x0) {
        if (RVar1 == RENDER_DEVICE_TYPE_METAL) {
          iVar3 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
          if (*(char *)(CONCAT44(extraout_var,iVar3) + 8) == '\x06') goto LAB_001de434;
        }
        iVar3 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar2);
        pTVar5 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>
                           ((ITexture *)CONCAT44(extraout_var_00,iVar3));
        if ((pTVar5->super_TextureBase<Diligent::EngineVkImplTraits>).m_State !=
            RESOURCE_STATE_UNKNOWN) {
          if (SubpassIndex <
              (Args_1->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.SubpassCount) {
            RVar4 = RenderPassBase<Diligent::EngineVkImplTraits>::GetAttachmentState
                              (&((this->m_pActiveRenderPass).m_pObject)->
                                super_RenderPassBase<Diligent::EngineVkImplTraits>,SubpassIndex,
                               (Uint32)uVar7);
          }
          else {
            RVar4 = *(RESOURCE_STATE *)
                     ((long)&((Args_1->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                              .m_Desc.pAttachments)->Format + lVar8);
          }
          (pTVar5->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RVar4;
        }
      }
LAB_001de434:
      lVar8 = lVar8 + 0x10;
    }
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateAttachmentStates(Uint32 SubpassIndex)
{
    if (m_RenderPassAttachmentsTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
        return;

    DEV_CHECK_ERR(m_pActiveRenderPass != nullptr, "There is no active render pass");
    DEV_CHECK_ERR(m_pBoundFramebuffer != nullptr, "There is no active framebuffer");

    const RenderPassDesc&  RPDesc = m_pActiveRenderPass->GetDesc();
    const FramebufferDesc& FBDesc = m_pBoundFramebuffer->GetDesc();
    VERIFY(FBDesc.AttachmentCount == RPDesc.AttachmentCount,
           "Framebuffer attachment count (", FBDesc.AttachmentCount, ") is not consistent with the render pass attachment count (", RPDesc.AttachmentCount, ")");
    VERIFY_EXPR(SubpassIndex <= RPDesc.SubpassCount);
    const bool IsMetal = m_pDevice->GetDeviceInfo().IsMetalDevice();
    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        if (ITextureView* pView = FBDesc.ppAttachments[i])
        {
            if (IsMetal && pView->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            TextureImplType* pTex = ClassPtrCast<TextureImplType>(pView->GetTexture());
            if (pTex->IsInKnownState())
            {
                RESOURCE_STATE CurrState = SubpassIndex < RPDesc.SubpassCount ?
                    m_pActiveRenderPass->GetAttachmentState(SubpassIndex, i) :
                    RPDesc.pAttachments[i].FinalState;
                pTex->SetState(CurrState);
            }
        }
    }
}